

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

bool __thiscall
math::wide_integer::uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::wr_string<char*>
          (uintwide_t<131072u,unsigned_int,std::allocator<void>,false> *this,char *str_result,
          uint_fast8_t base_rep,bool show_base,bool show_pos,bool is_uppercase,
          unsigned_fast_type field_width,char fill_char_str)

{
  char cVar1;
  unsigned_fast_type uVar2;
  pointer pvVar3;
  bool bVar4;
  byte bVar5;
  size_type sVar6;
  uint uVar7;
  const_iterator pvVar8;
  byte *pbVar9;
  reference pvVar10;
  pointer pvVar11;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *v;
  ulong local_170;
  unsigned_fast_type local_168;
  unsigned_fast_type dst;
  signed_fast_type pos_2;
  undefined1 local_150 [8];
  string_storage_hex_type str_temp_2;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> t_2;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> local_118;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> local_100;
  undefined1 local_e8 [8];
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> tmp;
  signed_fast_type pos_1;
  undefined1 local_c0 [8];
  string_storage_dec_type str_temp_1;
  undefined1 local_a0 [7];
  bool str_has_neg_sign;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> t_1;
  byte local_79;
  ulong uStack_78;
  char c;
  signed_fast_type pos;
  allocator_type local_5a;
  value_type local_59;
  undefined1 local_58 [8];
  string_storage_oct_type str_temp;
  undefined1 local_38 [4];
  limb_type mask;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> t;
  bool wr_string_is_ok;
  bool is_uppercase_local;
  bool show_pos_local;
  bool show_base_local;
  uint_fast8_t base_rep_local;
  char *str_result_local;
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *this_local;
  
  t.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
  _3_1_ = 1;
  t.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
  _4_1_ = is_uppercase;
  t.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
  _5_1_ = show_pos;
  t.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
  _6_1_ = show_base;
  t.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
  _7_1_ = base_rep;
  if (base_rep == '\b') {
    uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::uintwide_t
              ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_38,
               (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)this);
    str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems._4_4_
         = 7;
    local_59 = '\0';
    std::allocator<char>::allocator();
    detail::fixed_dynamic_array<char,_43699U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
              ((fixed_dynamic_array<char,_43699U,_std::allocator<unsigned_int>_> *)local_58,0xaab3,
               &local_59,&local_5a);
    std::allocator<char>::~allocator(&local_5a);
    sVar6 = detail::fixed_dynamic_array<char,_43699U,_std::allocator<unsigned_int>_>::static_size();
    uStack_78 = (ulong)(sVar6 - 1);
    bVar4 = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::is_zero
                      ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_38);
    if (bVar4) {
      uStack_78 = uStack_78 - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_58,(size_type)uStack_78);
      *pvVar10 = '0';
    }
    else {
      while (bVar4 = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::is_zero
                               ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)
                                local_38), !bVar4 && 0 < (long)uStack_78) {
        pvVar8 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                 ::cbegin((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                           *)local_38);
        local_79 = (byte)*pvVar8 & 7;
        if (local_79 < 9) {
          local_79 = local_79 + 0x30;
        }
        uStack_78 = uStack_78 - 1;
        pbVar9 = (byte *)util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                         ::operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                       *)local_58,(size_type)uStack_78);
        *pbVar9 = local_79;
        operator>>=((uintwide_t<131072u,unsigned_int,std::allocator<void>,false> *)local_38,3);
      }
    }
    if (((t.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
          _6_1_ & 1) != 0) && (0 < (long)uStack_78)) {
      uStack_78 = uStack_78 - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_58,(size_type)uStack_78);
      *pvVar10 = '0';
    }
    if (((t.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
          _5_1_ & 1) != 0) && (0 < (long)uStack_78)) {
      uStack_78 = uStack_78 - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_58,(size_type)uStack_78);
      *pvVar10 = '+';
    }
    if (field_width != 0) {
      sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_58);
      t_1.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
      elems = (pointer)(ulong)(sVar6 - 1);
      field_width = detail::min_unsafe<unsigned_long>
                              (&field_width,
                               (unsigned_long *)
                               &t_1.values.
                                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                .elems);
      while (sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                     size((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                          local_58), cVar1 = fill_char_str,
            (long)((sVar6 - 1) - field_width) < (long)uStack_78) {
        uStack_78 = uStack_78 - 1;
        pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                  operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *
                             )local_58,(size_type)uStack_78);
        *pvVar10 = cVar1;
      }
    }
    sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                      ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                       local_58);
    pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::operator[]
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_58,sVar6 - 1);
    *pvVar10 = '\0';
    pvVar11 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::data
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_58);
    detail::strcpy_unsafe<char*,char*>(str_result,pvVar11 + uStack_78);
    detail::fixed_dynamic_array<char,_43699U,_std::allocator<unsigned_int>_>::~fixed_dynamic_array
              ((fixed_dynamic_array<char,_43699U,_std::allocator<unsigned_int>_> *)local_58);
    uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::~uintwide_t
              ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_38);
  }
  else if (base_rep == '\n') {
    uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::uintwide_t
              ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_a0,
               (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)this);
    str_temp_1.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
    _7_1_ = 0;
    pos_1._7_1_ = 0;
    std::allocator<char>::allocator();
    detail::fixed_dynamic_array<char,_39462U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
              ((fixed_dynamic_array<char,_39462U,_std::allocator<unsigned_int>_> *)local_c0,0x9a26,
               (value_type *)((long)&pos_1 + 7),(allocator_type *)((long)&pos_1 + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&pos_1 + 6));
    sVar6 = detail::fixed_dynamic_array<char,_39462U,_std::allocator<unsigned_int>_>::static_size();
    tmp.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
    elems = (pointer)(ulong)(sVar6 - 1);
    bVar4 = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::is_zero
                      ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_a0);
    if (bVar4) {
      tmp.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
      elems = (pointer)((long)tmp.values.
                              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                              .elems + -1);
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_c0,(size_type)
                                    tmp.values.
                                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                    .elems);
      *pvVar10 = '0';
    }
    else {
      while (bVar4 = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::is_zero
                               ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)
                                local_a0),
            !bVar4 && 0 < (long)tmp.values.
                                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                .elems) {
        uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::uintwide_t
                  ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_e8,
                   (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_a0);
        uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::eval_divide_by_single_limb
                  ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_a0,10,0,
                   (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)0x0);
        uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::uintwide_t
                  (&local_118,
                   (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_a0);
        v = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::mul_by_limb
                      (&local_118,10);
        wide_integer::operator-
                  (&local_100,
                   (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_e8,v);
        uVar7 = wide_integer::uintwide_t::operator_cast_to_unsigned_int((uintwide_t *)&local_100);
        tmp.values.
        super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
             (pointer)((long)tmp.values.
                             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                             .elems + -1);
        pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                  operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *
                             )local_c0,
                             (size_type)
                             tmp.values.
                             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                             .elems);
        *pvVar10 = (char)uVar7 + '0';
        uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::~uintwide_t(&local_100);
        uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::~uintwide_t(&local_118);
        uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::~uintwide_t
                  ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_e8);
      }
    }
    if ((0 < (long)tmp.values.
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elems) &&
       ((t.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
         .elems._5_1_ & 1) != 0)) {
      tmp.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
      elems = (pointer)((long)tmp.values.
                              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                              .elems + -1);
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_c0,(size_type)
                                    tmp.values.
                                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                    .elems);
      *pvVar10 = '+';
    }
    if (field_width != 0) {
      sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_c0);
      t_2.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
      elems = (pointer)(ulong)(sVar6 - 1);
      field_width = detail::min_unsafe<unsigned_long>
                              (&field_width,
                               (unsigned_long *)
                               &t_2.values.
                                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                .elems);
      while (pvVar3 = tmp.values.
                      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                      .elems,
            sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                              ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                *)local_c0), cVar1 = fill_char_str,
            (long)((sVar6 - 1) - field_width) < (long)pvVar3) {
        tmp.values.
        super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
             (pointer)((long)tmp.values.
                             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                             .elems + -1);
        pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                  operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *
                             )local_c0,
                             (size_type)
                             tmp.values.
                             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                             .elems);
        *pvVar10 = cVar1;
      }
    }
    sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                      ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                       local_c0);
    pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::operator[]
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_c0,sVar6 - 1);
    *pvVar10 = '\0';
    pvVar11 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::data
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_c0);
    detail::strcpy_unsafe<char*,char*>
              (str_result,
               pvVar11 + (long)tmp.values.
                               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                               .elems);
    detail::fixed_dynamic_array<char,_39462U,_std::allocator<unsigned_int>_>::~fixed_dynamic_array
              ((fixed_dynamic_array<char,_39462U,_std::allocator<unsigned_int>_> *)local_c0);
    uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::~uintwide_t
              ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)local_a0);
  }
  else if (base_rep == '\x10') {
    uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::uintwide_t
              ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)
               &str_temp_2.
                super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems,
               (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)this);
    pos_2._7_1_ = 0;
    std::allocator<char>::allocator();
    detail::fixed_dynamic_array<char,_32776U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
              ((fixed_dynamic_array<char,_32776U,_std::allocator<unsigned_int>_> *)local_150,0x8008,
               (value_type *)((long)&pos_2 + 7),(allocator_type *)((long)&pos_2 + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&pos_2 + 6));
    sVar6 = detail::fixed_dynamic_array<char,_32776U,_std::allocator<unsigned_int>_>::static_size();
    dst = (unsigned_fast_type)(sVar6 - 1);
    bVar4 = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::is_zero
                      ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)
                       &str_temp_2.
                        super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                        elems);
    if (bVar4) {
      dst = dst - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_150,(size_type)dst);
      *pvVar10 = '0';
    }
    else {
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_150,(size_type)dst);
      local_168 = uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::
                  extract_hex_digits<false,_nullptr>
                            ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)
                             &str_temp_2.
                              super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                              .elems,pvVar10,
                             (bool)(t.values.
                                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                    .elems._4_1_ & 1));
      dst = dst - local_168;
    }
    if (((t.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
          _6_1_ & 1) != 0) && (1 < (long)dst)) {
      bVar5 = ~t.values.
               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
               elems._4_1_;
      dst = dst - 1;
      pbVar9 = (byte *)util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                       operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                   *)local_150,(size_type)dst);
      *pbVar9 = (bVar5 & 1) << 5 | 0x58;
      dst = dst - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_150,(size_type)dst);
      *pvVar10 = '0';
    }
    if (((t.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
          _5_1_ & 1) != 0) && (0 < (long)dst)) {
      dst = dst - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_150,(size_type)dst);
      *pvVar10 = '+';
    }
    if (field_width != 0) {
      sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_150);
      local_170 = (ulong)(sVar6 - 1);
      field_width = detail::min_unsafe<unsigned_long>(&field_width,&local_170);
      while (uVar2 = dst,
            sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                              ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                *)local_150), cVar1 = fill_char_str,
            (long)((sVar6 - 1) - field_width) < (long)uVar2) {
        dst = dst - 1;
        pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                  operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *
                             )local_150,(size_type)dst);
        *pvVar10 = cVar1;
      }
    }
    sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                      ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                       local_150);
    pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::operator[]
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_150,sVar6 - 1);
    *pvVar10 = '\0';
    pvVar11 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::data
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_150);
    detail::strcpy_unsafe<char*,char*>(str_result,pvVar11 + dst);
    detail::fixed_dynamic_array<char,_32776U,_std::allocator<unsigned_int>_>::~fixed_dynamic_array
              ((fixed_dynamic_array<char,_32776U,_std::allocator<unsigned_int>_> *)local_150);
    uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::~uintwide_t
              ((uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)
               &str_temp_2.
                super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems);
  }
  else {
    t.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
    elems._3_1_ = 0;
  }
  return (bool)(t.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                elems._3_1_ & 1);
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }